

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O3

int LS_Plat_Stop(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  bool remove;
  
  if (arg3 == 1) {
    remove = false;
  }
  else if (arg3 == 2) {
    remove = true;
  }
  else {
    remove = gameinfo.gametype == GAME_Hexen;
  }
  EV_StopPlat(arg0,remove);
  return 1;
}

Assistant:

FUNC(LS_Plat_Stop)
// Plat_Stop (tag, remove?)
{
	bool remove;
	switch (arg3)
	{
	case 1:
		remove = false;
		break;
	case 2:
		remove = true;
		break;
	default:
		remove = gameinfo.gametype == GAME_Hexen;
		break;
	}
	EV_StopPlat(arg0, remove);
	return true;
}